

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall Imf_3_2::anon_unknown_6::TileBufferTask::execute(TileBufferTask *this)

{
  TileBuffer *pTVar1;
  size_t xStride;
  uint *puVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  Data *pDVar7;
  pointer pTVar8;
  long lVar9;
  pointer pTVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  bool bVar18;
  Box2i tileRange;
  char *readPtr;
  int local_5c;
  char *writePtr;
  char *compPtr;
  char *readPtr_1;
  undefined1 local_40 [8];
  int local_38;
  
  pTVar1 = this->_tileBuffer;
  pcVar17 = (char *)(pTVar1->sampleCount)._sizeY;
  pDVar7 = this->_ofd;
  writePtr = pcVar17;
  Imf_3_2::dataWindowForTile
            ((Imf_3_2 *)&tileRange,&pDVar7->tileDesc,pDVar7->minX,pDVar7->maxX,pDVar7->minY,
             pDVar7->maxY,(int)pTVar1->dataSize,*(int *)((long)&pTVar1->dataSize + 4),
             (int)pTVar1->uncompressedDataSize,*(int *)((long)&pTVar1->uncompressedDataSize + 4));
  lVar9 = (long)tileRange.max.x;
  lVar6 = (long)tileRange.min.x;
  iVar15 = (int)(lVar9 - lVar6) + 1;
  iVar5 = tileRange.max.y - tileRange.min.y;
  iVar16 = iVar15;
  if (tileRange.min.y <= tileRange.max.y) {
    pDVar7 = this->_ofd;
    iVar13 = tileRange.min.y;
    iVar11 = tileRange.max.y;
    local_5c = iVar15;
    do {
      pTVar8 = (pDVar7->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pDVar7->slices).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar8) {
        uVar14 = 0;
        uVar12 = 1;
        do {
          pTVar10 = pTVar8 + uVar14;
          if (pTVar8[uVar14].zero == true) {
            fillChannelWithZeroes(&writePtr,pDVar7->format,pTVar10->type,(long)iVar15);
          }
          else {
            xStride = pTVar10->xStride;
            readPtr = pTVar10->base +
                      (long)(iVar13 - tileRange.min.y * pTVar10->yTileCoords) * pTVar10->yStride +
                      (long)((1 - pTVar10->xTileCoords) * tileRange.min.x) * xStride;
            copyFromFrameBuffer(&writePtr,&readPtr,readPtr + xStride * (lVar9 - lVar6),xStride,
                                pDVar7->format,pTVar10->type);
          }
          pDVar7 = this->_ofd;
          pTVar8 = (pDVar7->slices).
                   super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(pDVar7->slices).
                          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 4) *
                   -0x5555555555555555;
          bVar18 = uVar12 <= uVar14;
          lVar4 = uVar14 - uVar12;
          uVar14 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
          iVar11 = tileRange.max.y;
        } while (bVar18 && lVar4 != 0);
      }
      bVar18 = iVar13 < iVar11;
      pcVar17 = writePtr;
      iVar13 = iVar13 + 1;
      iVar16 = local_5c;
    } while (bVar18);
  }
  pTVar1 = this->_tileBuffer;
  puVar2 = (uint *)(pTVar1->sampleCount)._sizeY;
  plVar3 = (long *)pTVar1->buffer;
  iVar15 = (int)pcVar17 - (int)puVar2;
  *(int *)&pTVar1->uncompressedData = iVar15;
  (pTVar1->sampleCount)._data = puVar2;
  if (plVar3 != (long *)0x0) {
    local_38 = tileRange.max.x;
    iVar15 = (**(code **)(*plVar3 + 0x28))(plVar3,puVar2,iVar15,local_40,&compPtr);
    pTVar1 = this->_tileBuffer;
    if (iVar15 < *(int *)&pTVar1->uncompressedData) {
      *(int *)&pTVar1->uncompressedData = iVar15;
      (pTVar1->sampleCount)._data = (uint *)compPtr;
    }
    else {
      pDVar7 = this->_ofd;
      if ((pDVar7->format == NATIVE) && (readPtr = (char *)(pTVar1->sampleCount)._sizeY, -1 < iVar5)
         ) {
        pTVar8 = (pDVar7->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pTVar10 = (pDVar7->slices).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        readPtr_1 = readPtr;
        iVar15 = 0;
        do {
          if (pTVar10 != pTVar8) {
            uVar14 = 0;
            uVar12 = 1;
            do {
              convertInPlace(&readPtr,&readPtr_1,pTVar8[uVar14].type,(long)iVar16);
              pTVar8 = (pDVar7->slices).
                       super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pTVar10 = (pDVar7->slices).
                        super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar14 = ((long)pTVar10 - (long)pTVar8 >> 4) * -0x5555555555555555;
              bVar18 = uVar12 <= uVar14;
              lVar6 = uVar14 - uVar12;
              uVar14 = uVar12;
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (bVar18 && lVar6 != 0);
          }
          bVar18 = iVar15 != iVar5;
          iVar15 = iVar15 + 1;
        } while (bVar18);
      }
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
            _ifd->tileDesc,
            _ifd->minX,
            _ifd->maxX,
            _ifd->minY,
            _ifd->maxY,
            _tileBuffer->dx,
            _tileBuffer->dy,
            _tileBuffer->lx,
            _tileBuffer->ly);

        //
        // Get the size of the tile.
        //

        Array<unsigned int> numPixelsPerScanLine;
        numPixelsPerScanLine.resizeErase (
            tileRange.max.y - tileRange.min.y + 1);

        int sizeOfTile          = 0;
        int maxBytesPerTileLine = 0;

        for (int y = tileRange.min.y; y <= tileRange.max.y; y++)
        {
            numPixelsPerScanLine[y - tileRange.min.y] = 0;

            int bytesPerLine = 0;

            for (int x = tileRange.min.x; x <= tileRange.max.x; x++)
            {
                int xOffset = _ifd->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _ifd->sampleCountYTileCoords * tileRange.min.y;

                int count = _ifd->getSampleCount (x - xOffset, y - yOffset);
                for (unsigned int c = 0; c < _ifd->slices.size (); ++c)
                {
                    // This slice does not exist in the file.
                    if (!_ifd->slices[c]->fill)
                    {
                        sizeOfTile +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                        bytesPerLine +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                    }
                }
                numPixelsPerScanLine[y - tileRange.min.y] += count;
            }

            if (bytesPerLine > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine;
        }

        // (TODO) don't do this every time.
        if (_tileBuffer->compressor != 0) delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor (
            _ifd->header.compression (),
            maxBytesPerTileLine,
            _ifd->tileDesc.ySize,
            _ifd->header);

        //
        // Uncompress the data, if necessary
        //

        if (_tileBuffer->compressor &&
            _tileBuffer->dataSize < static_cast<uint64_t> (sizeOfTile))
        {
            _tileBuffer->format = _tileBuffer->compressor->format ();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile (
                _tileBuffer->buffer,
                static_cast<int> (_tileBuffer->dataSize),
                tileRange,
                _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //

            _tileBuffer->format           = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }

        //
        // sanity check data size: the uncompressed data should be exactly
        // 'sizeOfTile' (if it's less, the file is corrupt and there'll be a buffer overrun)
        //
        if (_tileBuffer->dataSize != static_cast<uint64_t> (sizeOfTile))
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "size mismatch when reading deep tile: expected "
                    << sizeOfTile << "bytes of uncompressed data but got "
                    << _tileBuffer->dataSize);
        }

        //
        // Convert the tile of pixel data back from the machine-independent
        // representation, and store the result in the frame buffer.
        //

        const char* readPtr = _tileBuffer->uncompressedData;
        // points to where we
        // read from in the
        // tile block

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size (); ++i)
            {
                TInSliceInfo& slice = *_ifd->slices[i];

                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //

                int xOffsetForData = (slice.xTileCoords == 0) ? 0
                                                              : tileRange.min.x;
                int yOffsetForData = (slice.yTileCoords == 0) ? 0
                                                              : tileRange.min.y;
                int xOffsetForSampleCount =
                    (_ifd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForSampleCount =
                    (_ifd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (
                        readPtr,
                        slice.typeInFile,
                        numPixelsPerScanLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    copyIntoDeepFrameBuffer (
                        readPtr,
                        slice.pointerArrayBase,
                        _ifd->sampleCountSliceBase,
                        _ifd->sampleCountXStride,
                        _ifd->sampleCountYStride,
                        y,
                        tileRange.min.x,
                        tileRange.max.x,
                        xOffsetForSampleCount,
                        yOffsetForSampleCount,
                        xOffsetForData,
                        yOffsetForData,
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        slice.fill,
                        slice.fillValue,
                        _tileBuffer->format,
                        slice.typeInFrameBuffer,
                        slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}